

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_find
          (utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,time_point now,peek peek)

{
  size_type __n;
  bool bVar1;
  pointer ppVar2;
  reference e_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  optional<unsigned_long> oVar4;
  element *e;
  size_t element_idx;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_40;
  iterator keyed_position;
  peek peek_local;
  unsigned_long *key_local;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point now_local;
  bool local_10;
  
  keyed_position.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
  _M_cur._4_4_ = peek;
  this_local = (utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)now.__d.__r;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::find((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)(this + 0x50),key);
  element_idx = (size_t)std::
                        unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                        ::end((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                               *)(this + 0x50));
  bVar1 = std::__detail::operator!=
                    (&local_40,
                     (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
                     &element_idx);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
                         *)&local_40);
    __n = ppVar2->second;
    e_00 = std::
           vector<cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
           ::operator[]((vector<cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
                         *)(this + 0x38),__n);
    bVar1 = std::chrono::operator<
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&this_local,&e_00->m_expire_time);
    if (bVar1) {
      if (keyed_position.
          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur.
          _4_4_ == no) {
        do_access(this,e_00);
      }
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)&now_local,&e_00->m_value);
      uVar3 = extraout_RDX;
      goto LAB_001adc7b;
    }
    do_erase(this,__n);
  }
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&now_local);
  uVar3 = extraout_RDX_00;
LAB_001adc7b:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)now_local.__d.__r;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto do_find(const key_type& key, std::chrono::steady_clock::time_point now, peek peek) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];

            // Has the element TTL'ed?
            if (now < e.m_expire_time)
            {
                // Do not update items access if peeking.
                if (peek == peek::no)
                {
                    do_access(e);
                }
                return {e.m_value};
            }
            else
            {
                do_erase(element_idx);
            }
        }

        return {};
    }